

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

PipeThread * __thiscall
kj::anon_unknown_0::AsyncIoProviderImpl::newPipeThread
          (PipeThread *__return_storage_ptr__,AsyncIoProviderImpl *this,
          Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *startFunc)

{
  Disposer *pDVar1;
  Iface *pIVar2;
  int iVar3;
  Thread *this_00;
  int threadFd;
  int fds [2];
  Fault f;
  UnwindDetector _kjUnwindDetector2019;
  Own<kj::AsyncIoStream,_std::nullptr_t> pipe;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_58;
  int local_48;
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface,_std::nullptr_t>
  local_40;
  
  fds[0] = 0;
  fds[1] = 0;
  do {
    iVar3 = socketpair(1,0x80801,0,fds);
    if (-1 < iVar3) goto LAB_003e0e23;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x7e0,iVar3,"socketpair(AF_UNIX, type, 0, fds)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_003e0e23:
  iVar3 = fds[1];
  UnwindDetector::UnwindDetector(&_kjUnwindDetector2019);
  f.exception._0_1_ = 1;
  (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[2])
            (&pipe,this->lowLevel,(ulong)fds & 0xffffffff,7);
  local_48 = iVar3;
  pDVar1 = (startFunc->impl).disposer;
  pIVar2 = (startFunc->impl).ptr;
  (startFunc->impl).ptr = (Iface *)0x0;
  local_40.disposer = pDVar1;
  local_40.ptr = pIVar2;
  this_00 = (Thread *)operator_new(0x18);
  local_58.ptr = (Iface *)operator_new(0x20);
  (local_58.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00677da8;
  *(int *)&local_58.ptr[1]._vptr_Iface = iVar3;
  local_58.ptr[2]._vptr_Iface = (_func_int **)pDVar1;
  local_58.ptr[3]._vptr_Iface = (_func_int **)pIVar2;
  local_40.ptr = (Iface *)0x0;
  local_58.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::AsyncIoProviderImpl::newPipeThread(kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>)::{lambda()#3}>>
        ::instance;
  Thread::Thread(this_00,(Function<void_()> *)&local_58);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_58);
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface,_std::nullptr_t>
  ::dispose(&local_40);
  (__return_storage_ptr__->thread).disposer = (Disposer *)&kj::_::HeapDisposer<kj::Thread>::instance
  ;
  (__return_storage_ptr__->thread).ptr = this_00;
  (__return_storage_ptr__->pipe).disposer = pipe.disposer;
  (__return_storage_ptr__->pipe).ptr = pipe.ptr;
  pipe.ptr = (AsyncIoStream *)0x0;
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&pipe);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:2019:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:2019:5)>
               *)&f);
  return __return_storage_ptr__;
}

Assistant:

PipeThread newPipeThread(
      Function<void(AsyncIoProvider&, AsyncIoStream&, WaitScope&)> startFunc) override {
    int fds[2]{};
    int type = SOCK_STREAM;
#if __linux__ && !__BIONIC__
    type |= SOCK_NONBLOCK | SOCK_CLOEXEC;
#endif
    KJ_SYSCALL(socketpair(AF_UNIX, type, 0, fds));

    int threadFd = fds[1];
    KJ_ON_SCOPE_FAILURE(close(threadFd));

    auto pipe = lowLevel.wrapSocketFd(fds[0], NEW_FD_FLAGS);

    auto thread = heap<Thread>([threadFd,startFunc=kj::mv(startFunc)]() mutable {
      UnixEventPort eventPort;
      EventLoop eventLoop(eventPort);
      WaitScope waitScope(eventLoop);
      LowLevelAsyncIoProviderImpl lowLevel(eventPort);
      auto stream = lowLevel.wrapSocketFd(threadFd, NEW_FD_FLAGS);
      AsyncIoProviderImpl ioProvider(lowLevel);
      startFunc(ioProvider, *stream, waitScope);
    });

    return { kj::mv(thread), kj::mv(pipe) };
  }